

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingWriter::
     WriteConstant(unsigned_short constant,idx_t count,void *data_ptr,bool all_invalid)

{
  unsigned_short *puVar1;
  
  ReserveSpace((BitpackingCompressionState<unsigned_short,_true,_short> *)data_ptr,2);
  WriteMetaData((BitpackingCompressionState<unsigned_short,_true,_short> *)data_ptr,CONSTANT);
  puVar1 = *(unsigned_short **)((long)data_ptr + 0x40);
  *puVar1 = constant;
  *(unsigned_short **)((long)data_ptr + 0x40) = puVar1 + 1;
  UpdateStats((BitpackingCompressionState<unsigned_short,_true,_short> *)data_ptr,count);
  return;
}

Assistant:

static void WriteConstant(T constant, idx_t count, void *data_ptr, bool all_invalid) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}